

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O0

word Mpm_CutTruthFromDsd(Mpm_Man_t *pMan,Mpm_Cut_t *pCut,int iClass)

{
  int iVar1;
  word local_28;
  word uTruth;
  int i;
  int iClass_local;
  Mpm_Cut_t *pCut_local;
  Mpm_Man_t *pMan_local;
  
  local_28 = pMan->pDsd6[iClass].uTruth;
  if (pMan->pDsd6[iClass].nVars == *(uint *)&pCut->field_0x4 >> 0x1b) {
    for (uTruth._0_4_ = 0; (int)uTruth < (int)(*(uint *)&pCut->field_0x4 >> 0x1b);
        uTruth._0_4_ = (int)uTruth + 1) {
      iVar1 = Abc_LitIsCompl(pCut->pLeaves[(int)uTruth]);
      if (iVar1 != 0) {
        local_28 = Abc_Tt6Flip(local_28,(int)uTruth);
      }
    }
    return local_28;
  }
  __assert_fail("pMan->pDsd6[iClass].nVars == (int)pCut->nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                ,0x377,"word Mpm_CutTruthFromDsd(Mpm_Man_t *, Mpm_Cut_t *, int)");
}

Assistant:

word Mpm_CutTruthFromDsd( Mpm_Man_t * pMan, Mpm_Cut_t * pCut, int iClass )
{
    int i;
    word uTruth = pMan->pDsd6[iClass].uTruth;
    assert( pMan->pDsd6[iClass].nVars == (int)pCut->nLeaves );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( Abc_LitIsCompl(pCut->pLeaves[i]) )
            uTruth = Abc_Tt6Flip( uTruth, i ); 
    return uTruth;
}